

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doInspection(QPDFJob *this,QPDF *pdf)

{
  pointer *ppQVar1;
  element_type *peVar2;
  pointer pQVar3;
  bool bVar4;
  longlong i;
  Pipeline *pPVar5;
  char *cstr;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_98;
  undefined1 local_78 [32];
  QPDFObjectHandle local_58;
  long *local_48 [2];
  long local_38 [2];
  
  QPDFLogger::getInfo((QPDFLogger *)&local_98,
                      SUB81((((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->log).
                            super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  pQVar3 = local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.super__Vector_impl_data
      ._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->check ==
      true) {
    doCheck(this,pdf);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      show_npages == true) {
    QPDF::getRoot((QPDF *)local_78);
    ppQVar1 = &local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppQVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"/Pages","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_78 + 0x10),(string *)local_78);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/Count","");
    QPDFObjectHandle::getKey(&local_58,(string *)(local_78 + 0x10));
    i = QPDFObjectHandle::getIntValue(&local_58);
    pPVar5 = Pipeline::operator<<((Pipeline *)pQVar3,i);
    Pipeline::operator<<(pPVar5,"\n");
    if (local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_);
    }
    if (local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppQVar1) {
      operator_delete(local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)&(local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      show_encryption == true) {
    showEncryption(this,pdf);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      check_linearization == true) {
    bVar4 = QPDF::isLinearized(pdf);
    if (bVar4) {
      bVar4 = QPDF::checkLinearization(pdf);
      peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!bVar4) {
        peVar2->warnings = true;
        goto LAB_00179f97;
      }
      pPVar5 = Pipeline::operator<<
                         ((Pipeline *)pQVar3,
                          (peVar2->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      cstr = ": no linearization errors\n";
    }
    else {
      pPVar5 = Pipeline::operator<<
                         ((Pipeline *)pQVar3,
                          (((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      cstr = " is not linearized\n";
    }
    Pipeline::operator<<(pPVar5,cstr);
  }
LAB_00179f97:
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      show_linearization == true) {
    bVar4 = QPDF::isLinearized(pdf);
    if (bVar4) {
      QPDF::showLinearizationData(pdf);
    }
    else {
      pPVar5 = Pipeline::operator<<
                         ((Pipeline *)pQVar3,
                          (((this->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      Pipeline::operator<<(pPVar5," is not linearized\n");
    }
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->show_xref
      == true) {
    QPDF::showXRefTable(pdf);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((0 < peVar2->show_obj) || (peVar2->show_trailer == true)) {
    doShowObj(this,pdf);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      show_pages == true) {
    doShowPages(this,pdf);
  }
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      list_attachments == true) {
    doListAttachments(this,pdf);
  }
  if ((((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      attachment_to_show)._M_string_length != 0) {
    doShowAttachment(this,pdf);
  }
  QPDF::getWarnings(&local_98,pdf);
  pQVar3 = local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&local_98);
  if (pQVar3 != local_98.super__Vector_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->warnings =
         true;
  }
  return;
}

Assistant:

void
QPDFJob::doInspection(QPDF& pdf)
{
    auto& cout = *m->log->getInfo();
    if (m->check) {
        doCheck(pdf);
    }
    if (m->show_npages) {
        QTC::TC("qpdf", "QPDFJob npages");
        cout << pdf.getRoot().getKey("/Pages").getKey("/Count").getIntValue() << "\n";
    }
    if (m->show_encryption) {
        showEncryption(pdf);
    }
    if (m->check_linearization) {
        if (!pdf.isLinearized()) {
            cout << m->infilename.get() << " is not linearized\n";
        } else if (pdf.checkLinearization()) {
            cout << m->infilename.get() << ": no linearization errors\n";
        } else {
            m->warnings = true;
        }
    }
    if (m->show_linearization) {
        if (pdf.isLinearized()) {
            pdf.showLinearizationData();
        } else {
            cout << m->infilename.get() << " is not linearized\n";
        }
    }
    if (m->show_xref) {
        pdf.showXRefTable();
    }
    if ((m->show_obj > 0) || m->show_trailer) {
        doShowObj(pdf);
    }
    if (m->show_pages) {
        doShowPages(pdf);
    }
    if (m->list_attachments) {
        doListAttachments(pdf);
    }
    if (!m->attachment_to_show.empty()) {
        doShowAttachment(pdf);
    }
    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    }
}